

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmap.cpp
# Opt level: O1

bool SanityCheckASMap(vector<bool,_std::allocator<bool>_> *asmap,int bits)

{
  uint uVar1;
  ulong *puVar2;
  ulong *puVar3;
  pointer ppVar4;
  pointer ppVar5;
  uint extraout_EAX;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  uint32_t jump_offset;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> jumps;
  uint local_90;
  int local_88;
  uint local_7c;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> local_78;
  int local_5c;
  const_iterator local_58;
  const_iterator local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (asmap->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar3 = (asmap->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (asmap->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  local_58.super__Bit_iterator_base._M_offset = 0;
  local_78.
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c = bits;
  local_58.super__Bit_iterator_base._M_p = puVar2;
  local_48.super__Bit_iterator_base._M_p = puVar3;
  local_48.super__Bit_iterator_base._M_offset = uVar1;
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::reserve
            (&local_78,(long)bits);
  iVar8 = 1;
  bVar9 = false;
  local_90 = extraout_EAX;
  do {
    ppVar5 = local_78.
             super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar4 = local_78.
             super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_58.super__Bit_iterator_base._M_p == puVar3 &&
        local_58.super__Bit_iterator_base._M_offset == uVar1) {
      local_90._0_1_ = 0;
      break;
    }
    local_88 = (int)puVar2;
    if ((local_78.
         super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         local_78.
         super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (local_58.super__Bit_iterator_base._M_offset +
        ((int)local_58.super__Bit_iterator_base._M_p - local_88) * 8 <
        local_78.
        super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].first)) {
      uVar6 = anon_unknown.dwarf_59e72bd::DecodeBits
                        (&local_58,&local_48,'\0',
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         (anonymous_namespace)::TYPE_BIT_SIZES);
      switch(uVar6) {
      case 0:
        if (iVar8 == 3) {
LAB_00e170e4:
          iVar8 = 3;
          local_90 = 0;
          goto LAB_00e17163;
        }
        uVar6 = anon_unknown.dwarf_59e72bd::DecodeBits
                          (&local_58,&local_48,'\x01',
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           (anonymous_namespace)::ASN_BIT_SIZES);
        if (uVar6 == 0xffffffff) goto LAB_00e1713b;
        if (ppVar4 == ppVar5) {
          if ((long)(((ulong)uVar1 - (ulong)local_58.super__Bit_iterator_base._M_offset) +
                    ((long)puVar3 - (long)local_58.super__Bit_iterator_base._M_p) * 8) < 8) {
            local_90 = 1;
            if (local_58.super__Bit_iterator_base._M_p != puVar3 ||
                local_58.super__Bit_iterator_base._M_offset != uVar1) {
              do {
                bVar10 = (*local_58.super__Bit_iterator_base._M_p &
                         1L << ((byte)local_58.super__Bit_iterator_base._M_offset & 0x3f)) == 0;
                local_90 = (uint)bVar10;
                if (!bVar10) break;
                bVar10 = local_58.super__Bit_iterator_base._M_offset == 0x3f;
                local_58.super__Bit_iterator_base._M_offset =
                     local_58.super__Bit_iterator_base._M_offset + 1;
                if (bVar10) {
                  local_58.super__Bit_iterator_base._M_offset = 0;
                }
                local_58.super__Bit_iterator_base._M_p =
                     local_58.super__Bit_iterator_base._M_p + bVar10;
              } while (local_58.super__Bit_iterator_base._M_p != puVar3 ||
                       local_58.super__Bit_iterator_base._M_offset != uVar1);
            }
            bVar10 = false;
          }
          else {
            bVar10 = false;
            local_90 = 0;
          }
        }
        else {
          if (ppVar5[-1].first !=
              ((int)local_58.super__Bit_iterator_base._M_p - local_88) * 8 +
              local_58.super__Bit_iterator_base._M_offset) goto LAB_00e172d4;
          local_5c = ppVar5[-1].second;
          local_78.
          super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar5 + -1;
          iVar8 = 1;
          bVar10 = true;
        }
        break;
      case 1:
        uVar6 = anon_unknown.dwarf_59e72bd::DecodeBits
                          (&local_58,&local_48,'\x11',
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           (anonymous_namespace)::JUMP_BIT_SIZES);
        if ((uVar6 == 0xffffffff) ||
           ((long)(((ulong)uVar1 - (ulong)local_58.super__Bit_iterator_base._M_offset) +
                  ((long)puVar3 - (long)local_58.super__Bit_iterator_base._M_p) * 8) <
            (long)(ulong)uVar6)) {
LAB_00e1713b:
          bVar10 = false;
          local_90 = 0;
        }
        else if (local_5c == 0) {
LAB_00e172d4:
          bVar10 = false;
          local_90 = 0;
        }
        else {
          local_5c = local_5c + -1;
          local_7c = local_58.super__Bit_iterator_base._M_offset + uVar6 +
                     ((int)local_58.super__Bit_iterator_base._M_p - local_88) * 8;
          if ((ppVar4 == ppVar5) || (local_7c < ppVar5[-1].first)) {
            std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>::
            emplace_back<unsigned_int&,int&>
                      ((vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>
                        *)&local_78,&local_7c,&local_5c);
            iVar8 = 1;
            bVar10 = true;
          }
          else {
            bVar10 = false;
            local_90 = 0;
          }
        }
        break;
      case 2:
        uVar6 = anon_unknown.dwarf_59e72bd::DecodeBits
                          (&local_58,&local_48,'\x02',
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           (anonymous_namespace)::MATCH_BIT_SIZES);
        if (uVar6 == 0xffffffff) {
          bVar10 = false;
          local_90 = 0;
        }
        else {
          if (uVar6 == 0) {
            uVar7 = 0x20;
          }
          else {
            uVar7 = 0x1f;
            if (uVar6 != 0) {
              for (; uVar6 >> uVar7 == 0; uVar7 = uVar7 - 1) {
              }
            }
            uVar7 = uVar7 ^ 0x1f;
          }
          if (uVar6 < 0x100) {
            if (iVar8 != 2) {
              bVar9 = false;
            }
            if (!bVar9) goto LAB_00e1724a;
          }
          else {
LAB_00e1724a:
            bVar9 = uVar6 < 0x100;
            if ((int)(0x1f - uVar7) <= local_5c) {
              iVar8 = 2;
              bVar10 = true;
              local_5c = local_5c - (0x1f - uVar7);
              goto LAB_00e1727d;
            }
          }
          bVar10 = false;
          local_90 = 0;
        }
LAB_00e1727d:
        if (bVar10) goto LAB_00e17281;
        goto LAB_00e17286;
      case 3:
        if (iVar8 == 3) goto LAB_00e170e4;
        uVar6 = anon_unknown.dwarf_59e72bd::DecodeBits
                          (&local_58,&local_48,'\x01',
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           (anonymous_namespace)::ASN_BIT_SIZES);
        local_90 = (uint)((byte)local_90 & uVar6 != 0xffffffff);
        if (uVar6 == 0xffffffff) goto LAB_00e17163;
        iVar8 = 3;
        goto LAB_00e17281;
      default:
        local_90 = 0;
LAB_00e17163:
        bVar10 = false;
        goto LAB_00e17289;
      }
      if (bVar10) {
LAB_00e17281:
        bVar10 = true;
      }
      else {
LAB_00e17286:
        bVar10 = false;
      }
    }
    else {
      bVar10 = false;
      local_90 = 0;
    }
LAB_00e17289:
  } while (bVar10);
  if (local_78.
      super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)((byte)local_90 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool SanityCheckASMap(const std::vector<bool>& asmap, int bits)
{
    const std::vector<bool>::const_iterator begin = asmap.begin(), endpos = asmap.end();
    std::vector<bool>::const_iterator pos = begin;
    std::vector<std::pair<uint32_t, int>> jumps; // All future positions we may jump to (bit offset in asmap -> bits to consume left)
    jumps.reserve(bits);
    Instruction prevopcode = Instruction::JUMP;
    bool had_incomplete_match = false;
    while (pos != endpos) {
        uint32_t offset = pos - begin;
        if (!jumps.empty() && offset >= jumps.back().first) return false; // There was a jump into the middle of the previous instruction
        Instruction opcode = DecodeType(pos, endpos);
        if (opcode == Instruction::RETURN) {
            if (prevopcode == Instruction::DEFAULT) return false; // There should not be any RETURN immediately after a DEFAULT (could be combined into just RETURN)
            uint32_t asn = DecodeASN(pos, endpos);
            if (asn == INVALID) return false; // ASN straddles EOF
            if (jumps.empty()) {
                // Nothing to execute anymore
                if (endpos - pos > 7) return false; // Excessive padding
                while (pos != endpos) {
                    if (*pos) return false; // Nonzero padding bit
                    ++pos;
                }
                return true; // Sanely reached EOF
            } else {
                // Continue by pretending we jumped to the next instruction
                offset = pos - begin;
                if (offset != jumps.back().first) return false; // Unreachable code
                bits = jumps.back().second; // Restore the number of bits we would have had left after this jump
                jumps.pop_back();
                prevopcode = Instruction::JUMP;
            }
        } else if (opcode == Instruction::JUMP) {
            uint32_t jump = DecodeJump(pos, endpos);
            if (jump == INVALID) return false; // Jump offset straddles EOF
            if (int64_t{jump} > int64_t{endpos - pos}) return false; // Jump out of range
            if (bits == 0) return false; // Consuming bits past the end of the input
            --bits;
            uint32_t jump_offset = pos - begin + jump;
            if (!jumps.empty() && jump_offset >= jumps.back().first) return false; // Intersecting jumps
            jumps.emplace_back(jump_offset, bits);
            prevopcode = Instruction::JUMP;
        } else if (opcode == Instruction::MATCH) {
            uint32_t match = DecodeMatch(pos, endpos);
            if (match == INVALID) return false; // Match bits straddle EOF
            int matchlen = std::bit_width(match) - 1;
            if (prevopcode != Instruction::MATCH) had_incomplete_match = false;
            if (matchlen < 8 && had_incomplete_match) return false; // Within a sequence of matches only at most one should be incomplete
            had_incomplete_match = (matchlen < 8);
            if (bits < matchlen) return false; // Consuming bits past the end of the input
            bits -= matchlen;
            prevopcode = Instruction::MATCH;
        } else if (opcode == Instruction::DEFAULT) {
            if (prevopcode == Instruction::DEFAULT) return false; // There should not be two successive DEFAULTs (they could be combined into one)
            uint32_t asn = DecodeASN(pos, endpos);
            if (asn == INVALID) return false; // ASN straddles EOF
            prevopcode = Instruction::DEFAULT;
        } else {
            return false; // Instruction straddles EOF
        }
    }
    return false; // Reached EOF without RETURN instruction
}